

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O3

void SL::WS_LITE::
     ReadBody<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
               (shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                *socket,shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> *extradata)

{
  uchar uVar1;
  byte bVar2;
  element_type *peVar3;
  ulong uVar4;
  void *__src;
  long lVar5;
  bool bVar6;
  char cVar7;
  uchar *puVar8;
  size_t sVar9;
  long *plVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  char cVar12;
  char *pcVar13;
  int iVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  size_type __dnew;
  shared_ptr<unsigned_char> buffer;
  shared_ptr<unsigned_char> ptr;
  mutable_buffers_1 local_1f0;
  undefined1 local_1e0 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  element_type *local_1b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b0;
  undefined1 local_1a8 [36];
  uint uStack_184;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_180;
  element_type *peStack_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  element_type *local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  element_type *local_158;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_150;
  ios_base local_138 [264];
  error_code local_30;
  
  peVar3 = (socket->
           super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  uVar1 = peVar3->ReceiveHeader[1];
  p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)(char)uVar1;
  if ((long)p_Var15 < 0) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    local_1f0.super_mutable_buffer.data_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x33;
    local_1a8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1a8,(ulong)&local_1f0);
    local_1a8._16_8_ = local_1f0.super_mutable_buffer.data_;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1a8._0_8_ + 0x20))->
    _vptr__Sp_counted_base = (_func_int **)0x6d65726975716572;
    *(undefined8 *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1a8._0_8_ + 0x20))->_M_use_count =
         0x20746f6e20746e65;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1a8._0_8_ + 0x10))->
    _vptr__Sp_counted_base = (_func_int **)0x7561636562206e6f;
    *(undefined8 *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1a8._0_8_ + 0x10))->_M_use_count =
         0x206b73616d206573;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._0_8_)->_vptr__Sp_counted_base =
         (_func_int **)0x20676e69736f6c43;
    *(undefined8 *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._0_8_)->_M_use_count
         = 0x697463656e6e6f63;
    *(undefined4 *)
     ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1a8._0_8_ + 0x20))->
             _M_weak_count + 3) = 0x74656d20;
    local_1a8._8_8_ = local_1f0.super_mutable_buffer.data_;
    *(char *)((long)(_func_int ***)local_1f0.super_mutable_buffer.data_ +
             (long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._0_8_)->
                    _vptr__Sp_counted_base) = '\0';
    sendclosemessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
              (socket,0x3ea,(string *)local_1a8);
  }
  else {
    bVar2 = peVar3->ReceiveHeader[0];
    if (((bVar2 & 0x30) == 0) && (((bVar2 & 0x40) == 0 || (peVar3->ExtensionOption != NO_OPTIONS))))
    {
      if (uVar1 == '\x7f') {
        uVar4 = *(ulong *)(peVar3->ReceiveHeader + 2);
        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                   (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                   (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28
                  | uVar4 << 0x38);
      }
      else if (uVar1 == '~') {
        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (ulong)(ushort)(*(ushort *)(peVar3->ReceiveHeader + 2) << 8 |
                                 *(ushort *)(peVar3->ReceiveHeader + 2) >> 8);
      }
      if ((byte)((bVar2 & 0xf) - 8) < 3) {
        if (p_Var15 < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x7e) {
          if (p_Var15 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_1a8._0_8_ = (basic_stream_socket<asio::ip::tcp> *)0x0;
            local_1a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            ProcessControlMessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
                      (socket,(shared_ptr<unsigned_char> *)local_1a8,0,extradata);
            local_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_;
          }
          else {
            local_1b8 = (element_type *)operator_new__((ulong)p_Var15);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<unsigned_char*,SL::WS_LITE::ReadBody<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>(std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>const&,std::shared_ptr<asio::basic_streambuf<std::allocator<char>>>const&)::_lambda(unsigned_char*)_1_,std::allocator<void>,void>
                      (&local_1b0,local_1b8);
            local_1f0.super_mutable_buffer.size_ =
                 (size_t)(extradata->
                         super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr;
            __src = *(void **)&((element_type *)local_1f0.super_mutable_buffer.size_)->field_0x10;
            local_1a8._16_8_ =
                 (long)*(void **)&((element_type *)local_1f0.super_mutable_buffer.size_)->field_0x28
                 - (long)__src;
            if (p_Var15 <= (ulong)local_1a8._16_8_) {
              local_1a8._16_8_ = p_Var15;
            }
            if (*(void **)&((element_type *)local_1f0.super_mutable_buffer.size_)->field_0x28 !=
                __src) {
              memcpy(local_1b8,__src,local_1a8._16_8_);
              local_1f0.super_mutable_buffer.size_ =
                   (size_t)(extradata->
                           super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr;
              pcVar13 = *(char **)&((element_type *)local_1f0.super_mutable_buffer.size_)->
                                   field_0x28;
              if (*(char **)&((element_type *)local_1f0.super_mutable_buffer.size_)->field_0x18 <
                  pcVar13) {
                *(pointer *)&((element_type *)local_1f0.super_mutable_buffer.size_)->field_0x8 =
                     (((element_type *)local_1f0.super_mutable_buffer.size_)->buffer_).
                     super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                     ._M_start;
                *(char **)&((element_type *)local_1f0.super_mutable_buffer.size_)->field_0x18 =
                     pcVar13;
              }
              lVar5 = *(long *)&((element_type *)local_1f0.super_mutable_buffer.size_)->field_0x10;
              iVar14 = (int)pcVar13 - (int)lVar5;
              if ((char *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._16_8_)
                                  ->_vptr__Sp_counted_base + lVar5) <= pcVar13) {
                iVar14 = (int)local_1a8._16_8_;
              }
              *(long *)&((element_type *)local_1f0.super_mutable_buffer.size_)->field_0x10 =
                   iVar14 + lVar5;
            }
            peVar3 = (socket->
                     super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            local_1a8._8_8_ = local_1b8 + local_1a8._16_8_;
            local_1e0._0_8_ =
                 (extradata->
                 super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_refcount._M_pi;
            local_1e0._8_8_ = peVar3;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._0_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._0_8_)->_M_use_count
                     + 1;
                UNLOCK();
                local_1e0._8_8_ =
                     (socket->
                     super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._0_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._0_8_)->_M_use_count
                     + 1;
              }
            }
            local_1d0 = (socket->
                        super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                        )._M_refcount._M_pi;
            if (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_1d0->_M_use_count = local_1d0->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_1d0->_M_use_count = local_1d0->_M_use_count + 1;
              }
            }
            local_1a8._16_8_ = (long)p_Var15 - local_1a8._16_8_;
            local_1a8._0_8_ = &peVar3->Socket;
            if (local_1b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_1b0._M_pi)->_M_use_count = (local_1b0._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_1b0._M_pi)->_M_use_count = (local_1b0._M_pi)->_M_use_count + 1;
              }
            }
            local_1a8._24_8_ = 0;
            stack0xfffffffffffffe78 =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)uStack_184 << 0x20);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._0_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._0_8_)->_M_use_count
                     + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._0_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._0_8_)->_M_use_count
                     + 1;
              }
            }
            if (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_1d0->_M_use_count = local_1d0->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_1d0->_M_use_count = local_1d0->_M_use_count + 1;
              }
            }
            local_158 = local_1b8;
            _Stack_150._M_pi = local_1b0._M_pi;
            local_1c8 = 0;
            uStack_1c0 = 0;
            local_30._M_value = 0;
            local_1f0.super_mutable_buffer.data_ = p_Var15;
            local_180 = p_Var15;
            peStack_178 = (element_type *)local_1f0.super_mutable_buffer.size_;
            local_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._0_8_;
            local_168 = (element_type *)local_1e0._8_8_;
            local_160._M_pi = local_1d0;
            local_30._M_cat = (error_category *)std::_V2::system_category();
            asio::detail::
            read_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketProtocol.h:425:34)>
            ::operator()((read_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_include_internal_WebSocketProtocol_h:425:34)>
                          *)local_1a8,&local_30,0,1);
            if (_Stack_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_150._M_pi);
            }
            if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160._M_pi);
            }
            if (local_170._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170._M_pi);
            }
            if (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._0_8_);
            }
          }
          if (local_1b0._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            return;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b0._M_pi);
          return;
        }
        p_Var11 = p_Var15;
        cVar7 = '\x04';
        do {
          cVar12 = cVar7;
          if (p_Var11 < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x64) {
            cVar12 = cVar12 + -2;
            goto LAB_001472c8;
          }
          if (p_Var11 < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3e8) {
            cVar12 = cVar12 + -1;
            goto LAB_001472c8;
          }
          if (p_Var11 < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2710) goto LAB_001472c8;
          bVar6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1869f < p_Var11;
          p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)p_Var11 / 10000);
          cVar7 = cVar12 + '\x04';
        } while (bVar6);
        cVar12 = cVar12 + '\x01';
LAB_001472c8:
        local_1f0.super_mutable_buffer.data_ =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0;
        std::__cxx11::string::_M_construct((ulong)&local_1f0,cVar12);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_1f0.super_mutable_buffer.data_,
                   (uint)local_1f0.super_mutable_buffer.size_,(unsigned_long)p_Var15);
        plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,0x15eadf);
        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar10 + 2);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar10 == p_Var15) {
          local_1a8._16_8_ = p_Var15->_vptr__Sp_counted_base;
          local_1a8._24_8_ = plVar10[3];
          local_1a8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1a8 + 0x10);
        }
        else {
          local_1a8._16_8_ = p_Var15->_vptr__Sp_counted_base;
          local_1a8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar10;
        }
        local_1a8._8_8_ = plVar10[1];
        *plVar10 = (long)p_Var15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        sendclosemessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
                  (socket,0x3ea,(string *)local_1a8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1a8 + 0x10)) {
          operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
        }
        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_1f0.super_mutable_buffer.data_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0.super_mutable_buffer.data_ ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0) {
          return;
        }
        goto LAB_00146f99;
      }
      if ((bVar2 & 0xf) < 3) {
        pcVar13 = (char *)((long)&p_Var15->_vptr__Sp_counted_base + peVar3->ReceiveBufferSize);
        peVar3->ReceiveBufferSize = (size_t)pcVar13;
        if ((char *)((peVar3->Parent).
                     super___shared_ptr<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->MaxPayload < pcVar13) {
          local_1a8._0_8_ = local_1a8 + 0x10;
          local_1f0.super_mutable_buffer.data_ =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x20;
          local_1a8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1a8,(ulong)&local_1f0);
          local_1a8._16_8_ = local_1f0.super_mutable_buffer.data_;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1a8._0_8_ + 0x10))->
          _vptr__Sp_counted_base = (_func_int **)0x6c79615078614d20;
          *(undefined8 *)
           &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1a8._0_8_ + 0x10))->_M_use_count
               = 0x657a69732064616f;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._0_8_)->_vptr__Sp_counted_base
               = (_func_int **)0x2064616f6c796150;
          *(undefined8 *)
           &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._0_8_)->_M_use_count =
               0x6465646565637865;
          local_1a8._8_8_ = local_1f0.super_mutable_buffer.data_;
          *(char *)((long)(_func_int ***)local_1f0.super_mutable_buffer.data_ +
                   (long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._0_8_)->
                          _vptr__Sp_counted_base) = '\0';
          sendclosemessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
                    (socket,0x3f1,(string *)local_1a8);
        }
        else {
          if (p_Var15 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ProcessMessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
                      (socket,extradata);
            return;
          }
          puVar8 = (uchar *)realloc(peVar3->ReceiveBuffer,(size_t)pcVar13);
          peVar3 = (socket->
                   super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          peVar3->ReceiveBuffer = puVar8;
          if (puVar8 != (uchar *)0x0) {
            sVar9 = ReadFromExtraData(puVar8 + (peVar3->ReceiveBufferSize - (long)p_Var15),
                                      (size_t)p_Var15,extradata);
            peVar3 = (socket->
                     super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            local_1f0.super_mutable_buffer.size_ = (long)p_Var15 - sVar9;
            local_1f0.super_mutable_buffer.data_ =
                 peVar3->ReceiveBuffer + sVar9 + (peVar3->ReceiveBufferSize - (long)p_Var15);
            local_1a8._8_8_ =
                 (extradata->
                 super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
            local_1a8._16_8_ =
                 (extradata->
                 super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_refcount._M_pi;
            local_1a8._24_8_ = peVar3;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._16_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._16_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._16_8_)->
                     _M_use_count + 1;
                UNLOCK();
                local_1a8._24_8_ =
                     (socket->
                     super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._16_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._16_8_)->
                     _M_use_count + 1;
              }
            }
            unique0x00012000 =
                 (socket->
                 super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_refcount._M_pi;
            if (unique0x00012000 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                unique0x00012000->_M_use_count = unique0x00012000->_M_use_count + 1;
                UNLOCK();
              }
              else {
                unique0x00012000->_M_use_count = unique0x00012000->_M_use_count + 1;
              }
            }
            local_1a8._0_8_ = p_Var15;
            asio::
            async_read<asio::basic_stream_socket<asio::ip::tcp>,asio::mutable_buffers_1,SL::WS_LITE::ReadBody<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>(std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>const&,std::shared_ptr<asio::basic_streambuf<std::allocator<char>>>const&)::_lambda(std::error_code_const&,unsigned_long)_2_>
                      (&peVar3->Socket,&local_1f0,(type *)local_1a8,(type *)0x0);
            ReadBody<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>(std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>const&,std::shared_ptr<asio::basic_streambuf<std::allocator<char>>>const&)
            ::{lambda(std::error_code_const&,unsigned_long)#2}::~error_code
                      ((_lambda_std__error_code_const__unsigned_long__2_ *)local_1a8);
            return;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"MEMORY ALLOCATION ERROR!!! Tried to realloc ",0x2c);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          Log(ERROR_log_level,
              "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketProtocol.h"
              ,0x1cd,"ReadBody",(ostringstream *)local_1a8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          local_1a8._0_8_ = local_1a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"Payload exceeded MaxPayload size","");
          sendclosemessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
                    (socket,0x3f1,(string *)local_1a8);
        }
      }
      else {
        local_1a8._0_8_ = local_1a8 + 0x10;
        local_1f0.super_mutable_buffer.data_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x24;
        local_1a8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1a8,(ulong)&local_1f0);
        local_1a8._16_8_ = local_1f0.super_mutable_buffer.data_;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1a8._0_8_ + 0x10))->
        _vptr__Sp_counted_base = (_func_int **)0x766e6f6e202e6e6f;
        *(undefined8 *)
         &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1a8._0_8_ + 0x10))->_M_use_count =
             0x20706f2064696c61;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._0_8_)->_vptr__Sp_counted_base =
             (_func_int **)0x20676e69736f6c43;
        *(undefined8 *)
         &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._0_8_)->_M_use_count =
             0x697463656e6e6f63;
        *(undefined4 *)
         &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1a8._0_8_ + 0x20))->
          _vptr__Sp_counted_base = 0x65646f63;
        local_1a8._8_8_ = local_1f0.super_mutable_buffer.data_;
        *(char *)((long)(_func_int ***)local_1f0.super_mutable_buffer.data_ +
                 (long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._0_8_)->
                        _vptr__Sp_counted_base) = '\0';
        sendclosemessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
                  (socket,0x3ea,(string *)local_1a8);
      }
    }
    else {
      local_1a8._0_8_ = local_1a8 + 0x10;
      local_1f0.super_mutable_buffer.data_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1f;
      local_1a8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1a8,(ulong)&local_1f0);
      local_1a8._16_8_ = local_1f0.super_mutable_buffer.data_;
      builtin_strncpy((char *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                      local_1a8._0_8_)->_M_weak_count + 3),"ion. rsv",8);
      builtin_strncpy((char *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                      (local_1a8._0_8_ + 0x10))->_vptr__Sp_counted_base + 7),
                      " bit set",8);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._0_8_)->_vptr__Sp_counted_base =
           (_func_int **)0x20676e69736f6c43;
      *(undefined8 *)
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._0_8_)->_M_use_count =
           0x697463656e6e6f63;
      local_1a8._8_8_ = local_1f0.super_mutable_buffer.data_;
      *(char *)((long)(_func_int ***)local_1f0.super_mutable_buffer.data_ +
               (long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._0_8_)->
                      _vptr__Sp_counted_base) = '\0';
      sendclosemessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
                (socket,0x3ea,(string *)local_1a8);
    }
  }
  local_1e0._0_8_ = local_1a8._16_8_;
  p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._0_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1a8 + 0x10)) {
    return;
  }
LAB_00146f99:
  operator_delete(p_Var15,(ulong)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                         local_1e0._0_8_)->_vptr__Sp_counted_base + 1));
  return;
}

Assistant:

inline void ReadBody(const SOCKETTYPE &socket, const std::shared_ptr<asio::streambuf> &extradata)
    {
        if (!DidPassMaskRequirement(socket->ReceiveHeader, isServer)) { // Close connection if it did not meet the mask requirement.
            return sendclosemessage<isServer>(socket, 1002, "Closing connection because mask requirement not met");
        }
        if (getrsv2(socket->ReceiveHeader) || getrsv3(socket->ReceiveHeader) ||
            (getrsv1(socket->ReceiveHeader) && socket->ExtensionOption == ExtensionOptions::NO_OPTIONS)) {
            return sendclosemessage<isServer>(socket, 1002, "Closing connection. rsv bit set");
        }
        auto opcode = static_cast<OpCode>(getOpCode(socket->ReceiveHeader));

        size_t size = getpayloadLength1(socket->ReceiveHeader);
        switch (size) {
        case 126:
            size = ntoh(getpayloadLength2(socket->ReceiveHeader));
            break;
        case 127:
            size = static_cast<size_t>(ntoh(getpayloadLength8(socket->ReceiveHeader)));
            if (size > std::numeric_limits<std::size_t>::max()) {
                return sendclosemessage<isServer>(socket, 1009, "Payload exceeded MaxPayload size");
            }
            break;
        default:
            break;
        }

        size += AdditionalBodyBytesToRead(isServer);
        if (opcode == OpCode::PING || opcode == OpCode::PONG || opcode == OpCode::CLOSE) {
            if (size - AdditionalBodyBytesToRead(isServer) > CONTROLBUFFERMAXSIZE) {
                return sendclosemessage<isServer>(socket, 1002, "Payload exceeded for control frames. Size requested " + std::to_string(size));
            }
            else if (size > 0) {
                auto buffer = std::shared_ptr<unsigned char>(new unsigned char[size], [](unsigned char *p) { delete[] p; });

                auto bytestoread = size;
                auto dataconsumed = ReadFromExtraData(buffer.get(), bytestoread, extradata);
                bytestoread -= dataconsumed;

                asio::async_read(socket->Socket, asio::buffer(buffer.get() + dataconsumed, bytestoread),
                                 [size, extradata, socket, buffer](const std::error_code &ec, size_t) {
                                     if (!ec) {
                                         UnMaskMessage(size, buffer.get(), isServer);
                                         auto tempsize = size - AdditionalBodyBytesToRead(isServer);
                                         return ProcessControlMessage<isServer>(socket, buffer, tempsize, extradata);
                                     }
                                     else {
                                         return sendclosemessage<isServer>(socket, 1002, "ReadBody Error " + ec.message());
                                     }
                                 });
            }
            else {
                std::shared_ptr<unsigned char> ptr;
                return ProcessControlMessage<isServer>(socket, ptr, 0, extradata);
            }
        }

        else if (opcode == OpCode::TEXT || opcode == OpCode::BINARY || opcode == OpCode::CONTINUATION) {
            auto addedsize = socket->ReceiveBufferSize + size;
            if (addedsize > std::numeric_limits<std::size_t>::max()) {
                SL_WS_LITE_LOG(Logging_Levels::ERROR_log_level, "payload exceeds memory on system!!! ");
                return sendclosemessage<isServer>(socket, 1009, "Payload exceeded MaxPayload size");
            }
            socket->ReceiveBufferSize = addedsize;

            if (socket->ReceiveBufferSize > socket->Parent->MaxPayload) {
                return sendclosemessage<isServer>(socket, 1009, "Payload exceeded MaxPayload size");
            }
            if (socket->ReceiveBufferSize > std::numeric_limits<std::size_t>::max()) {
                SL_WS_LITE_LOG(Logging_Levels::ERROR_log_level, "payload exceeds memory on system!!! ");
                return sendclosemessage<isServer>(socket, 1009, "Payload exceeded MaxPayload size");
            }

            if (size > 0) {
                socket->ReceiveBuffer = static_cast<unsigned char *>(realloc(socket->ReceiveBuffer, socket->ReceiveBufferSize));
                if (!socket->ReceiveBuffer) {
                    SL_WS_LITE_LOG(Logging_Levels::ERROR_log_level, "MEMORY ALLOCATION ERROR!!! Tried to realloc " << socket->ReceiveBufferSize);
                    return sendclosemessage<isServer>(socket, 1009, "Payload exceeded MaxPayload size");
                }

                auto bytestoread = size;
                auto dataconsumed = ReadFromExtraData(socket->ReceiveBuffer + socket->ReceiveBufferSize - size, bytestoread, extradata);
                bytestoread -= dataconsumed;
                asio::async_read(socket->Socket, asio::buffer(socket->ReceiveBuffer + socket->ReceiveBufferSize - size + dataconsumed, bytestoread),
                                 [size, extradata, socket](const std::error_code &ec, size_t) {
                                     if (!ec) {
                                         auto buffer = socket->ReceiveBuffer + socket->ReceiveBufferSize - size;
                                         UnMaskMessage(size, buffer, isServer);
                                         socket->ReceiveBufferSize -= AdditionalBodyBytesToRead(isServer);
                                         return ProcessMessage<isServer>(socket, extradata);
                                     }
                                     else {
                                         return sendclosemessage<isServer>(socket, 1002, "ReadBody Error " + ec.message());
                                     }
                                 });
            }
            else {
                return ProcessMessage<isServer>(socket, extradata);
            }
        }
        else {
            return sendclosemessage<isServer>(socket, 1002, "Closing connection. nonvalid op code");
        }
    }